

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> *
__thiscall
mxx::gatherv<std::array<unsigned_long,3ul>>
          (vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
           *__return_storage_ptr__,mxx *this,array<unsigned_long,_3UL> *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm)

{
  int *piVar1;
  uint uVar2;
  ulong __new_size;
  undefined4 in_register_0000008c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar1 = *(int **)size;
  __new_size = 0;
  if (piVar1 != *(int **)(size + 8)) {
    do {
      uVar2 = (int)__new_size + *piVar1;
      __new_size = (ulong)uVar2;
      piVar1 = piVar1 + 2;
    } while (piVar1 != *(int **)(size + 8));
    __new_size = (ulong)(int)uVar2;
  }
  if (((comm *)CONCAT44(in_register_0000008c,root))->m_rank == (int)recv_sizes) {
    std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
    resize(__return_storage_ptr__,__new_size);
  }
  gatherv<std::array<unsigned_long,3ul>>
            ((array<unsigned_long,_3UL> *)this,(size_t)data,
             (__return_storage_ptr__->
             super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)size,(int)recv_sizes,
             (comm *)CONCAT44(in_register_0000008c,root));
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    if (comm.rank() == root)
        result.resize(total_size);
    gatherv(data, size, &result[0], recv_sizes, root, comm);
    return result;
}